

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestBaseAndMaxLevels::initTextures(TextureViewTestBaseAndMaxLevels *this)

{
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  void *pvVar6;
  TestError *this_00;
  uint uVar7;
  uint local_8c;
  uint n_component;
  uchar *pixel_data_ptr;
  float lerp_factor;
  uint x;
  uchar *row_data_ptr;
  uint y;
  uint pixel_size;
  uchar *data;
  uint mipmap_width;
  uint mipmap_height;
  float end_rgba [4];
  float start_rgba [4];
  uint local_1c;
  uint n_mipmap;
  Functions *gl;
  TextureViewTestBaseAndMaxLevels *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_result_to_id);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_to_id);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_view_to_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGenTextures() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2571);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_to_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2575);
  (**(code **)(lVar5 + 0x1380))
            (0xde1,this->m_texture_n_levels,0x8058,this->m_texture_width,this->m_texture_height);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glTexStorage2D() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2578);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x813c,2);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri() call failed for GL_TEXTURE_BASE_LEVEL pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x257c);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x813d,4);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri() call failed for GL_TEXTURE_MAX_LEVEL pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2580);
  local_1c = 0;
  while( true ) {
    if (this->m_texture_n_levels <= local_1c) {
      (**(code **)(lVar5 + 0x14b0))(this->m_view_to_id,0xde1,this->m_to_id,0x8058,0,5,0,1);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glTextureView() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x25be);
      (**(code **)(lVar5 + 0xb8))(0xde1,this->m_view_to_id);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glBindTexture() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x25c2);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x813c,1);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glTexParameteri() call failed for GL_TEXTURE_BASE_LEVEL pname",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x25c5);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x813d,2);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glTexParameteri() call failed for GL_TEXTURE_MAX_LEVEL pname",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x25c9);
      (**(code **)(lVar5 + 0xb8))(0xde1,this->m_result_to_id);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glBindTexture() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x25cd);
      (**(code **)(lVar5 + 0x1380))(0xde1,1,0x8058,this->m_view_width,this->m_view_height);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glTexStorage2D() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x25d1);
      return;
    }
    end_rgba[2] = (float)local_1c / 10.0;
    end_rgba[3] = (float)(local_1c + 1) / 10.0;
    mipmap_width = (uint)((float)(10 - local_1c) / 10.0);
    mipmap_height = (uint)((float)(9 - local_1c) / 10.0);
    end_rgba[0] = (float)(8 - local_1c) / 10.0;
    end_rgba[1] = (float)(7 - local_1c) / 10.0;
    uVar7 = this->m_texture_height >> ((byte)local_1c & 0x1f);
    uVar3 = this->m_texture_width >> ((byte)local_1c & 0x1f);
    pvVar6 = operator_new__((ulong)(uVar3 * uVar7 * this->m_texture_n_components));
    if (pvVar6 == (void *)0x0) break;
    for (row_data_ptr._4_4_ = 0; row_data_ptr._4_4_ < uVar7;
        row_data_ptr._4_4_ = row_data_ptr._4_4_ + 1) {
      for (pixel_data_ptr._4_4_ = 0; pixel_data_ptr._4_4_ < uVar3;
          pixel_data_ptr._4_4_ = pixel_data_ptr._4_4_ + 1) {
        for (local_8c = 0; local_8c < this->m_texture_n_components; local_8c = local_8c + 1) {
          *(char *)((long)pvVar6 +
                   (ulong)local_8c +
                   (ulong)(pixel_data_ptr._4_4_ << 2) + (ulong)(uVar3 * row_data_ptr._4_4_ * 4)) =
               (char)(int)((end_rgba[(ulong)local_8c + 2] *
                            ((float)pixel_data_ptr._4_4_ / (float)uVar3) +
                           (float)(&mipmap_width)[local_8c] *
                           (1.0 - (float)pixel_data_ptr._4_4_ / (float)uVar3)) * 255.0);
        }
      }
    }
    (**(code **)(lVar5 + 0x13b8))(0xde1,local_1c,0,0,uVar3,uVar7,0x1908,0x1401,pvVar6);
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"glTexSubImage2D() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x25b6);
    local_1c = local_1c + 1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Out of memory",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
             ,0x2593);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TextureViewTestBaseAndMaxLevels::initTextures()
{
	/* Generate IDs first */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_result_to_id);
	gl.genTextures(1, &m_to_id);
	gl.genTextures(1, &m_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call(s) failed");

	/* Set up parent texture object's storage */
	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	gl.texStorage2D(GL_TEXTURE_2D, m_texture_n_levels, GL_RGBA8, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed");

	/* Configure GL_TEXTURE_BASE_LEVEL parameter of the texture object as per test spec */
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed for GL_TEXTURE_BASE_LEVEL pname");

	/* Configure GL_TEXTURE_MAX_LEVEL parameter of the texture object as per test spec */
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed for GL_TEXTURE_MAX_LEVEL pname");

	/* Set up mip-maps */
	for (unsigned int n_mipmap = 0; n_mipmap < m_texture_n_levels; ++n_mipmap)
	{
		const float start_rgba[] = { /* As per test specification */
									 float(n_mipmap + 0) / 10.0f, float(n_mipmap + 1) / 10.0f,
									 float(n_mipmap + 2) / 10.0f, float(n_mipmap + 3) / 10.0f
		};
		const float end_rgba[] = { float(10 - (n_mipmap + 0)) / 10.0f, float(10 - (n_mipmap + 1)) / 10.0f,
								   float(10 - (n_mipmap + 2)) / 10.0f, float(10 - (n_mipmap + 3)) / 10.0f };

		/* Allocate space for the layer data */
		const unsigned int mipmap_height = m_texture_height >> n_mipmap;
		const unsigned int mipmap_width  = m_texture_width >> n_mipmap;
		unsigned char*	 data			 = new unsigned char[mipmap_width * mipmap_height * m_texture_n_components];

		if (data == NULL)
		{
			TCU_FAIL("Out of memory");
		}

		/* Fill the buffer with layer data */
		const unsigned int pixel_size = 4 /* components */;

		for (unsigned int y = 0; y < mipmap_height; ++y)
		{
			unsigned char* row_data_ptr = data + mipmap_width * y * pixel_size;

			for (unsigned int x = 0; x < mipmap_width; ++x)
			{
				const float	lerp_factor	= float(x) / float(mipmap_width);
				unsigned char* pixel_data_ptr = row_data_ptr + x * pixel_size;

				for (unsigned int n_component = 0; n_component < m_texture_n_components; n_component++)
				{
					pixel_data_ptr[n_component] = (unsigned char)((start_rgba[n_component] * lerp_factor +
																   end_rgba[n_component] * (1.0f - lerp_factor)) *
																  255.0f);
				}
			} /* for (all columns) */
		}	 /* for (all rows) */

		/* Upload the layer data */
		gl.texSubImage2D(GL_TEXTURE_2D, n_mipmap, 0, /* xoffset */
						 0,							 /* yoffset */
						 mipmap_width, mipmap_height, GL_RGBA, GL_UNSIGNED_BYTE, data);

		/* Release the data buffer */
		delete[] data;

		data = DE_NULL;

		/* Make sure the API call finished successfully */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage2D() call failed");
	} /* for (all mip-maps) */

	/* Configure the texture view storage as per spec. */
	gl.textureView(m_view_to_id, GL_TEXTURE_2D, m_to_id, GL_RGBA8, 0, /* minlevel */
				   5,												  /* numlevels */
				   0,												  /* minlayer */
				   1);												  /* numlayers */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

	/* Configure the texture view's GL_TEXTURE_BASE_LEVEL parameter */
	gl.bindTexture(GL_TEXTURE_2D, m_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed for GL_TEXTURE_BASE_LEVEL pname");

	/* Configure the texture view's GL_TEXTURE_MAX_LEVEL parameter */
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed for GL_TEXTURE_MAX_LEVEL pname");

	/* Set up result texture storage */
	gl.bindTexture(GL_TEXTURE_2D, m_result_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	gl.texStorage2D(GL_TEXTURE_2D, 1, /* We will only attach the first level of the result texture to the FBO */
					GL_RGBA8, m_view_width, m_view_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed");
}